

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

void __thiscall libtorrent::aux::http_parser::http_parser(http_parser *this,int flags)

{
  _Rb_tree_header *p_Var1;
  
  this->m_recv_pos = 0;
  (this->m_method)._M_dataplus._M_p = (pointer)&(this->m_method).field_2;
  (this->m_method)._M_string_length = 0;
  (this->m_method).field_2._M_local_buf[0] = '\0';
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  (this->m_protocol)._M_dataplus._M_p = (pointer)&(this->m_protocol).field_2;
  (this->m_protocol)._M_string_length = 0;
  (this->m_protocol).field_2._M_local_buf[0] = '\0';
  (this->m_server_message)._M_dataplus._M_p = (pointer)&(this->m_server_message).field_2;
  (this->m_server_message)._M_string_length = 0;
  (this->m_server_message).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_header)._M_t._M_impl.super__Rb_tree_header;
  *(undefined4 *)&this->m_content_length = 0xffffffff;
  *(undefined4 *)((long)&this->m_content_length + 4) = 0xffffffff;
  *(undefined4 *)&this->m_range_start = 0xffffffff;
  *(undefined4 *)((long)&this->m_range_start + 4) = 0xffffffff;
  this->m_range_end = -1;
  (this->m_header)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_header)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_header)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_header)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_chunked_ranges).
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chunked_ranges).
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])&(this->m_recv_buffer).m_len = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_header)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  this->m_cur_chunk_end = -1;
  this->m_status_code = -1;
  this->m_chunk_header_size = 0;
  this->m_partial_chunk_header = 0;
  this->m_flags = flags;
  *(undefined4 *)((long)&this->m_state + 3) = 0;
  this->m_body_start_pos = 0;
  this->m_state = read_status;
  return;
}

Assistant:

http_parser::http_parser(int const flags) : m_flags(flags) {}